

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

void lddmc_unmark_rec(mddnode_t node)

{
  ulong uVar1;
  ulong uVar2;
  
  while( true ) {
    uVar1 = node->a;
    if ((uVar1 & 1) == 0) {
      return;
    }
    uVar2 = uVar1 >> 1 & 0x7fffffffffff;
    node->a = uVar1 & 0xfffffffffffffffe;
    if (1 < uVar2) {
      lddmc_unmark_rec((mddnode_t)(nodes->data + uVar2 * 0x10));
    }
    if (node->b < 0x40000) break;
    node = (mddnode_t)(nodes->data + (node->b >> 0xd & 0xfffffffffffffff0));
  }
  return;
}

Assistant:

static void
lddmc_unmark_rec(mddnode_t node)
{
    if (lddmc_unmark(node)) {
        MDD node_right = mddnode_getright(node);
        if (node_right > lddmc_true) lddmc_unmark_rec(LDD_GETNODE(node_right));
        MDD node_down = mddnode_getdown(node);
        if (node_down > lddmc_true) lddmc_unmark_rec(LDD_GETNODE(node_down));
    }
}